

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::Flatten(Prog *this)

{
  allocator<int> *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  InstOp IVar4;
  int iVar5;
  pointer pIVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  Inst *pIVar12;
  Inst *__src;
  int __c;
  char *pcVar13;
  Inst *local_188;
  int local_e0;
  int local_dc;
  int i_2;
  int total;
  Inst *ip;
  int id;
  int i_1;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  local_c0;
  __normal_iterator<const_re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  local_b8;
  const_iterator i;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> flatmap;
  SparseArray<int> rootmap;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> stk;
  SparseSet q;
  Prog *this_local;
  
  if ((this->did_flatten_ & 1U) == 0) {
    this->did_flatten_ = true;
    iVar3 = size(this);
    SparseSet::SparseSet
              ((SparseSet *)
               &stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,iVar3);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    iVar3 = size(this);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_40,(long)iVar3);
    iVar3 = size(this);
    SparseArray<int>::SparseArray
              ((SparseArray<int> *)
               &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar3);
    MarkRoots(this,(SparseArray<int> *)
                   &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
              (SparseSet *)
              &stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
    iVar3 = SparseArray<int>::size
                      ((SparseArray<int> *)
                       &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    this_00 = (allocator<int> *)
              ((long)&flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(this_00);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_90,(long)iVar3,this_00);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::vector
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
    iVar3 = size(this);
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i,(long)iVar3);
    local_c0._M_current =
         (IndexValue *)
         SparseArray<int>::begin
                   ((SparseArray<int> *)
                    &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<re2::SparseArray<int>::IndexValue_const*,std::vector<re2::SparseArray<int>::IndexValue,std::allocator<re2::SparseArray<int>::IndexValue>>>
    ::__normal_iterator<re2::SparseArray<int>::IndexValue*>
              ((__normal_iterator<re2::SparseArray<int>::IndexValue_const*,std::vector<re2::SparseArray<int>::IndexValue,std::allocator<re2::SparseArray<int>::IndexValue>>>
                *)&local_b8,&local_c0);
    while( true ) {
      _id = SparseArray<int>::end
                      ((SparseArray<int> *)
                       &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=
                        (&local_b8,
                         (__normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
                          *)&id);
      if (!bVar2) break;
      sVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                        ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
      pIVar6 = __gnu_cxx::
               __normal_iterator<const_re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
               ::operator->(&local_b8);
      iVar3 = SparseArray<int>::IndexValue::value(pIVar6);
      pcVar13 = (char *)(long)iVar3;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_90,(size_type)pcVar13);
      *pvVar9 = (value_type)sVar7;
      pIVar6 = __gnu_cxx::
               __normal_iterator<const_re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
               ::operator->(&local_b8);
      pcVar13 = SparseArray<int>::IndexValue::index(pIVar6,pcVar13,__c);
      EmitList(this,(int)pcVar13,
               (SparseArray<int> *)
               &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i,
               (SparseSet *)
               &stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
      pvVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                         ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
      Inst::set_last(pvVar8);
      __gnu_cxx::
      __normal_iterator<const_re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
      ::operator++(&local_b8);
    }
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_90);
    this->list_count_ = (int)sVar7;
    for (ip._4_4_ = 0; ip._4_4_ < 8; ip._4_4_ = ip._4_4_ + 1) {
      this->inst_count_[ip._4_4_] = 0;
    }
    for (ip._0_4_ = 0;
        sVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                          ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i),
        (int)ip < (int)sVar7; ip._0_4_ = (int)ip + 1) {
      pvVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                         ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i,
                          (long)(int)ip);
      IVar4 = Inst::opcode(pvVar8);
      if (IVar4 != kInstAltMatch) {
        iVar3 = Inst::out(pvVar8);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_90,(long)iVar3);
        Inst::set_out(pvVar8,*pvVar9);
      }
      IVar4 = Inst::opcode(pvVar8);
      this->inst_count_[IVar4] = this->inst_count_[IVar4] + 1;
    }
    local_dc = 0;
    for (local_e0 = 0; local_e0 < 8; local_e0 = local_e0 + 1) {
      local_dc = this->inst_count_[local_e0] + local_dc;
    }
    sVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                      ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
    if (local_dc != (int)sVar7) {
      __assert_fail("(total) == (static_cast<int>(flat.size()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                    0x1b0,"void re2::Prog::Flatten()");
    }
    iVar3 = start_unanchored(this);
    if (iVar3 == 0) {
      iVar3 = start(this);
      if (iVar3 != 0) {
        __assert_fail("(start()) == (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc"
                      ,0x1b4,"void re2::Prog::Flatten()");
      }
    }
    else {
      iVar3 = start_unanchored(this);
      iVar5 = start(this);
      if (iVar3 == iVar5) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_90,1);
        set_start_unanchored(this,*pvVar9);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_90,1);
        set_start(this,*pvVar9);
      }
      else {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_90,1);
        set_start_unanchored(this,*pvVar9);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_90,2);
        set_start(this,*pvVar9);
      }
    }
    sVar7 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                      ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
    this->size_ = (int)sVar7;
    if (this->inst_ != (Inst *)0x0) {
      operator_delete__(this->inst_);
    }
    uVar10 = (ulong)this->size_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar11 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pIVar12 = (Inst *)operator_new__(uVar11);
    if (uVar10 != 0) {
      local_188 = pIVar12;
      do {
        Inst::Inst(local_188);
        local_188 = local_188 + 1;
      } while (local_188 != pIVar12 + uVar10);
    }
    this->inst_ = pIVar12;
    pIVar12 = this->inst_;
    __src = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::data
                      ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
    memmove(pIVar12,__src,(long)this->size_ << 3);
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::~vector
              ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)&i);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
    SparseArray<int>::~SparseArray
              ((SparseArray<int> *)
               &flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
    SparseSet::~SparseSet
              ((SparseSet *)
               &stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  return;
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by EmitList()
  // because we call it in a loop and it would thrash the heap otherwise.
  SparseSet q(size());
  vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "roots".
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  MarkRoots(&rootmap, &q, &stk);

  // Second pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  vector<int> flatmap(rootmap.size());
  vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &q, &stk);
    flat.back().set_last();
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Third pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  delete[] inst_;
  inst_ = new Inst[size_];
  memmove(inst_, flat.data(), size_ * sizeof *inst_);
}